

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
::resize(raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>_>,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Hash,_phmap::priv::HashEq<vmips::VirtReg_*,_void>::Eq,_std::allocator<std::shared_ptr<vmips::VirtReg>_>_>
         *this,size_t new_capacity)

{
  size_t hashval;
  ctrl_t *p;
  size_t capacity;
  undefined1 auVar1 [16];
  size_t i;
  size_t sVar2;
  slot_type *old_slot;
  FindInfo FVar3;
  Layout LVar4;
  
  if ((new_capacity == 0) || ((new_capacity + 1 & new_capacity) != 0)) {
    __assert_fail("IsValidCapacity(new_capacity)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SchrodingerZhu[P]backend/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x750,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, phmap::priv::HashEq<vmips::VirtReg *>::Hash, phmap::priv::HashEq<vmips::VirtReg *>::Eq, std::allocator<std::shared_ptr<vmips::VirtReg>>>::resize(size_t) [Policy = phmap::priv::FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>, Hash = phmap::priv::HashEq<vmips::VirtReg *>::Hash, Eq = phmap::priv::HashEq<vmips::VirtReg *>::Eq, Alloc = std::allocator<std::shared_ptr<vmips::VirtReg>>]"
                 );
  }
  p = this->ctrl_;
  old_slot = this->slots_;
  capacity = this->capacity_;
  this->capacity_ = new_capacity;
  initialize_slots(this);
  for (sVar2 = 0; capacity != sVar2; sVar2 = sVar2 + 1) {
    if (-1 < p[sVar2]) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = (old_slot->super___shared_ptr<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr;
      hashval = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,8) +
                SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar1,0);
      FVar3 = find_first_non_full(this,hashval);
      set_ctrl(this,FVar3.offset,(byte)hashval & 0x7f);
      FlatHashSetPolicy<std::shared_ptr<vmips::VirtReg>>::
      transfer<std::allocator<std::shared_ptr<vmips::VirtReg>>>
                ((allocator<std::shared_ptr<vmips::VirtReg>_> *)&this->settings_,
                 this->slots_ + FVar3.offset,old_slot);
    }
    old_slot = old_slot + 1;
  }
  if (capacity != 0) {
    LVar4 = MakeLayout(capacity);
    Deallocate<8ul,std::allocator<std::shared_ptr<vmips::VirtReg>>>
              ((allocator<std::shared_ptr<vmips::VirtReg>_> *)&this->settings_,p,
               LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>.
               size_[1] * 0x10 +
               (LVar4.super_LayoutType<sizeof___(Ts),_signed_char,_std::shared_ptr<vmips::VirtReg>_>
                .size_[0] + 7 & 0xfffffffffffffff8));
    return;
  }
  return;
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }